

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall DROPlayer::Start(DROPlayer *this)

{
  UINT8 UVar1;
  size_type sVar2;
  reference pvVar3;
  size_t sVar4;
  byte *pbVar5;
  UINT32 local_74;
  PLR_DEV_OPTS *local_70;
  reference pvStack_48;
  UINT8 deviceID;
  VGM_BASEDEV *clDev;
  DEV_GEN_CFG devCfg;
  PLR_DEV_OPTS *devOpts;
  DRO_CHIPDEV *cDev;
  ulong uStack_18;
  UINT8 retVal;
  size_t curDev;
  DROPlayer *this_local;
  
  for (uStack_18 = 0; uStack_18 < 3; uStack_18 = uStack_18 + 1) {
    this->_optDevMap[uStack_18] = 0xffffffffffffffff;
  }
  std::vector<_dro_chip_device,_std::allocator<_dro_chip_device>_>::clear(&this->_devices);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes);
  std::vector<_dro_chip_device,_std::allocator<_dro_chip_device>_>::resize(&this->_devices,sVar2);
  for (uStack_18 = 0;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes),
      uStack_18 < sVar2; uStack_18 = uStack_18 + 1) {
    pvStack_48 = std::vector<_dro_chip_device,_std::allocator<_dro_chip_device>_>::operator[]
                           (&this->_devices,uStack_18);
    (pvStack_48->base).defInf.dataPtr = (DEV_DATA *)0x0;
    (pvStack_48->base).linkDev = (VGM_BASEDEV *)0x0;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_devTypes,uStack_18);
    UVar1 = *pvVar3;
    sVar4 = DeviceID2OptionID(this,(UINT32)uStack_18);
    pvStack_48->optID = sVar4;
    if (pvStack_48->optID == 0xffffffffffffffff) {
      local_70 = (PLR_DEV_OPTS *)0x0;
    }
    else {
      local_70 = this->_devOpts + pvStack_48->optID;
    }
    devCfg._8_8_ = local_70;
    if (local_70 == (PLR_DEV_OPTS *)0x0) {
      local_74 = 0;
    }
    else {
      local_74 = local_70->emuCore;
    }
    clDev._0_4_ = local_74;
    if (local_70 == (PLR_DEV_OPTS *)0x0) {
      clDev._4_1_ = '\0';
    }
    else {
      clDev._4_1_ = local_70->srMode;
    }
    clDev._5_1_ = 0;
    devCfg.emuCore = 0x369e99;
    if (UVar1 == '\f') {
      devCfg.emuCore = 0xda7a64;
    }
    if ((local_70 == (PLR_DEV_OPTS *)0x0) || (local_70->smplRate == 0)) {
      devCfg._4_4_ = (this->super_PlayerBase)._outSmplRate;
    }
    else {
      devCfg._4_4_ = local_70->smplRate;
    }
    UVar1 = SndEmu_Start(UVar1,(DEV_GEN_CFG *)&clDev,(DEV_INFO *)pvStack_48);
    if (UVar1 == '\0') {
      SndEmu_GetDeviceFunc((pvStack_48->base).defInf.devDef,'\0','\x11',0,&pvStack_48->write);
      SetupLinkedDevices(&pvStack_48->base,(SETUPLINKDEV_CB)0x0,(void *)0x0);
      if (devCfg._8_8_ != 0) {
        if (((pvStack_48->base).defInf.devDef)->SetOptionBits != (DEVFUNC_OPTMASK)0x0) {
          (*((pvStack_48->base).defInf.devDef)->SetOptionBits)
                    ((pvStack_48->base).defInf.dataPtr,*(UINT32 *)(devCfg._8_8_ + 0xc));
        }
        this->_optDevMap[pvStack_48->optID] = uStack_18;
      }
      for (; pvStack_48 != (reference)0x0; pvStack_48 = (reference)(pvStack_48->base).linkDev) {
        if (((pvStack_48->base).defInf.devDef)->SetMuteMask != (DEVFUNC_OPTMASK)0x0) {
          (*((pvStack_48->base).defInf.devDef)->SetMuteMask)
                    ((pvStack_48->base).defInf.dataPtr,*(UINT32 *)(devCfg._8_8_ + 0x14));
        }
        Resmpl_SetVals(&(pvStack_48->base).resmpl,0xff,0x100,(this->super_PlayerBase)._outSmplRate);
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_devPanning,uStack_18);
        if ((*pbVar5 & 2) != 0) {
          (pvStack_48->base).resmpl.volumeL = 0;
        }
        pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_devPanning,uStack_18);
        if ((*pbVar5 & 1) != 0) {
          (pvStack_48->base).resmpl.volumeR = 0;
        }
        Resmpl_DevConnect(&(pvStack_48->base).resmpl,(DEV_INFO *)pvStack_48);
        Resmpl_Init(&(pvStack_48->base).resmpl);
      }
    }
    else {
      (pvStack_48->base).defInf.dataPtr = (DEV_DATA *)0x0;
      (pvStack_48->base).defInf.devDef = (DEV_DEF *)0x0;
    }
  }
  this->_playState = this->_playState | 1;
  (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])();
  if ((this->super_PlayerBase)._eventCbFunc != (PLAYER_EVENT_CB)0x0) {
    (*(this->super_PlayerBase)._eventCbFunc)
              (&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x01',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 DROPlayer::Start(void)
{
	size_t curDev;
	UINT8 retVal;
	
	for (curDev = 0; curDev < 3; curDev ++)
		_optDevMap[curDev] = (size_t)-1;
	
	_devices.clear();
	_devices.resize(_devTypes.size());
	for (curDev = 0; curDev < _devTypes.size(); curDev ++)
	{
		DRO_CHIPDEV* cDev = &_devices[curDev];
		PLR_DEV_OPTS* devOpts;
		DEV_GEN_CFG devCfg;
		VGM_BASEDEV* clDev;
		UINT8 deviceID;
		
		cDev->base.defInf.dataPtr = NULL;
		cDev->base.linkDev = NULL;
		deviceID = _devTypes[curDev];
		cDev->optID = DeviceID2OptionID(curDev);
		
		devOpts = (cDev->optID != (size_t)-1) ? &_devOpts[cDev->optID] : NULL;
		devCfg.emuCore = (devOpts != NULL) ? devOpts->emuCore : 0x00;
		devCfg.srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		devCfg.flags = 0x00;
		devCfg.clock = 3579545;
		if (deviceID == DEVID_YMF262)
			devCfg.clock *= 4;	// OPL3 uses a 14 MHz clock
		if (devOpts != NULL && devOpts->smplRate)
			devCfg.smplRate = devOpts->smplRate;
		else
			devCfg.smplRate = _outSmplRate;
		
		retVal = SndEmu_Start(deviceID, &devCfg, &cDev->base.defInf);
		if (retVal)
		{
			cDev->base.defInf.dataPtr = NULL;
			cDev->base.defInf.devDef = NULL;
			continue;
		}
		SndEmu_GetDeviceFunc(cDev->base.defInf.devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&cDev->write);
		
		SetupLinkedDevices(&cDev->base, NULL, NULL);
		
		if (devOpts != NULL)
		{
			if (cDev->base.defInf.devDef->SetOptionBits != NULL)
				cDev->base.defInf.devDef->SetOptionBits(cDev->base.defInf.dataPtr, devOpts->coreOpts);
			
			_optDevMap[cDev->optID] = curDev;
		}
		
		for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev)
		{
			if (clDev->defInf.devDef->SetMuteMask != NULL)
				clDev->defInf.devDef->SetMuteMask(clDev->defInf.dataPtr, devOpts->muteOpts.chnMute[0]);
			
			Resmpl_SetVals(&clDev->resmpl, 0xFF, 0x100, _outSmplRate);
			// do DualOPL2 hard panning by muting either the left or right speaker
			if (_devPanning[curDev] & 0x02)
				clDev->resmpl.volumeL = 0x00;
			if (_devPanning[curDev] & 0x01)
				clDev->resmpl.volumeR = 0x00;
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
	}
	
	_playState |= PLAYSTATE_PLAY;
	Reset();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_START, NULL);
	
	return 0x00;
}